

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanTargets(Cleaner *this,int target_count,char **targets)

{
  char *__s;
  State *this_00;
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  StringPiece local_a0;
  Node *local_90;
  Node *target;
  string err;
  uint64_t slash_bits;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string target_name;
  int i;
  char **targets_local;
  int target_count_local;
  Cleaner *this_local;
  
  Reset(this);
  PrintHeader(this);
  LoadDyndeps(this);
  for (target_name.field_2._12_4_ = 0; (int)target_name.field_2._12_4_ < target_count;
      target_name.field_2._12_4_ = target_name.field_2._12_4_ + 1) {
    __s = targets[(int)target_name.field_2._12_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
    std::allocator<char>::~allocator(&local_49);
    std::__cxx11::string::string((string *)&target);
    bVar1 = CanonicalizePath((string *)local_48,(uint64_t *)(err.field_2._M_local_buf + 8),
                             (string *)&target);
    if (bVar1) {
      this_00 = this->state_;
      StringPiece::StringPiece(&local_a0,(string *)local_48);
      local_90 = State::LookupNode(this_00,local_a0);
      if (local_90 == (Node *)0x0) {
        uVar2 = std::__cxx11::string::c_str();
        Error("unknown target \'%s\'",uVar2);
        this->status_ = 1;
      }
      else {
        bVar1 = IsVerbose(this);
        if (bVar1) {
          uVar2 = std::__cxx11::string::c_str();
          printf("Target %s\n",uVar2);
        }
        DoCleanTarget(this,local_90);
      }
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      uVar3 = std::__cxx11::string::c_str();
      Error("failed to canonicalize \'%s\': %s",uVar2,uVar3);
      this->status_ = 1;
    }
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)local_48);
  }
  PrintFooter(this);
  return this->status_;
}

Assistant:

int Cleaner::CleanTargets(int target_count, char* targets[]) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < target_count; ++i) {
    string target_name = targets[i];
    uint64_t slash_bits;
    string err;
    if (!CanonicalizePath(&target_name, &slash_bits, &err)) {
      Error("failed to canonicalize '%s': %s", target_name.c_str(), err.c_str());
      status_ = 1;
    } else {
      Node* target = state_->LookupNode(target_name);
      if (target) {
        if (IsVerbose())
          printf("Target %s\n", target_name.c_str());
        DoCleanTarget(target);
      } else {
        Error("unknown target '%s'", target_name.c_str());
        status_ = 1;
      }
    }
  }
  PrintFooter();
  return status_;
}